

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditFrameworkTests.cpp
# Opt level: O2

IterateResult __thiscall dit::anon_unknown_0::CaseListParserCase::iterate(CaseListParserCase *this)

{
  ostringstream *poVar1;
  char **value;
  ostringstream *poVar2;
  ostringstream *this_00;
  ostringstream *this_01;
  int iVar3;
  TestLog *pTVar4;
  MatchCase *pMVar5;
  PtrData<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_> data;
  bool bVar6;
  bool bVar7;
  MessageBuilder *pMVar8;
  TestError *this_02;
  long lVar9;
  char *description;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  int iVar10;
  undefined8 in_stack_fffffffffffffdc0;
  long lVar11;
  MovePtr<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_> caseListFilter;
  CommandLine cmdLine;
  char *argv [3];
  
  pTVar4 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  tcu::CommandLine::CommandLine(&cmdLine);
  caseListFilter.super_UniqueBase<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_>.
  m_data.ptr = (CaseListFilter *)0x0;
  poVar2 = (ostringstream *)(argv + 1);
  argv[0] = (char *)pTVar4;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::operator<<((ostream *)poVar2,"Input:\n\"");
  pMVar8 = tcu::MessageBuilder::operator<<((MessageBuilder *)argv,&this->m_caseList);
  std::operator<<((ostream *)&pMVar8->m_str,"\"");
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  argv[0] = "deqp";
  argv[1] = "--deqp-caselist";
  argv[2] = this->m_caseList;
  bVar6 = tcu::CommandLine::parse(&cmdLine,3,argv);
  if (bVar6) {
    tcu::CommandLine::createCaseListFilter
              ((MovePtr<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_> *)argv,
               &cmdLine,((this->super_TestCase).super_TestNode.m_testCtx)->m_curArchive);
    argv[0] = (char *)0x0;
    data.ptr._4_4_ = in_stack_fffffffffffffdbc;
    data.ptr._0_4_ = in_stack_fffffffffffffdb8;
    data._8_8_ = in_stack_fffffffffffffdc0;
    de::details::UniqueBase<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_>::
    assignData(&caseListFilter.
                super_UniqueBase<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_>,data
              );
    de::details::UniqueBase<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_>::
    ~UniqueBase((UniqueBase<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_> *)argv);
    poVar2 = (ostringstream *)(argv + 1);
    this_00 = (ostringstream *)(argv + 1);
    lVar11 = 0;
    iVar10 = 0;
    for (lVar9 = 0; iVar3 = this->m_numSubCases, lVar9 < iVar3; lVar9 = lVar9 + 1) {
      pMVar5 = this->m_subCases;
      argv[0] = (char *)pTVar4;
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::operator<<((ostream *)poVar2,"Checking \"");
      value = (char **)((long)&pMVar5->path + lVar11);
      pMVar8 = tcu::MessageBuilder::operator<<((MessageBuilder *)argv,value);
      poVar1 = &pMVar8->m_str;
      std::operator<<((ostream *)poVar1,"\"");
      std::operator<<((ostream *)poVar1,", expecting ");
      std::operator<<((ostream *)poVar1,
                      _ZZN3dit12_GLOBAL__N_124getMatchCaseExpectedDescENS0_9MatchCase8ExpectedEE5descs_rel
                      + *(int *)(
                                _ZZN3dit12_GLOBAL__N_124getMatchCaseExpectedDescENS0_9MatchCase8ExpectedEE5descs_rel
                                + (long)*(int *)((long)&pMVar5->expected + lVar11) * 4));
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      bVar6 = tcu::CaseListFilter::checkTestGroupName
                        (caseListFilter.
                         super_UniqueBase<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_>
                         .m_data.ptr,*value);
      bVar7 = tcu::CaseListFilter::checkTestCaseName
                        (caseListFilter.
                         super_UniqueBase<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_>
                         .m_data.ptr,*value);
      iVar3 = *(int *)((long)&pMVar5->expected + lVar11);
      if ((bVar6 == (iVar3 != 1)) || (bVar7 == (iVar3 != 2))) {
        argv[0] = (char *)pTVar4;
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::operator<<((ostream *)this_00,"   FAIL!");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)argv,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
      }
      else {
        this_01 = (ostringstream *)(argv + 1);
        argv[0] = (char *)pTVar4;
        std::__cxx11::ostringstream::ostringstream(this_01);
        std::operator<<((ostream *)this_01,"   pass");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)argv,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_01);
        iVar10 = iVar10 + 1;
      }
      lVar11 = lVar11 + 0x10;
    }
    description = "All passed";
    if (iVar10 != iVar3) {
      description = "Unexpected match result";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestNode.m_testCtx,(uint)(iVar10 != iVar3),description);
    de::details::UniqueBase<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_>::
    ~UniqueBase(&caseListFilter.
                 super_UniqueBase<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_>);
    tcu::CommandLine::~CommandLine(&cmdLine);
    return STOP;
  }
  this_02 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_02,"Failed to parse command line",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/internal/ditFrameworkTests.cpp"
             ,0x66);
  __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate (void)
	{
		TestLog&							log		= m_testCtx.getLog();
		tcu::CommandLine					cmdLine;
		de::MovePtr<tcu::CaseListFilter>	caseListFilter;
		int									numPass	= 0;

		log << TestLog::Message << "Input:\n\"" << m_caseList << "\"" << TestLog::EndMessage;

		{
			const char* argv[] =
			{
				"deqp",
				"--deqp-caselist",
				m_caseList
			};

			if (!cmdLine.parse(DE_LENGTH_OF_ARRAY(argv), argv))
				TCU_FAIL("Failed to parse command line");
		}

		caseListFilter = cmdLine.createCaseListFilter(m_testCtx.getArchive());

		for (int subCaseNdx = 0; subCaseNdx < m_numSubCases; subCaseNdx++)
		{
			const MatchCase&	curCase		= m_subCases[subCaseNdx];
			bool				matchGroup;
			bool				matchCase;

			log << TestLog::Message << "Checking \"" << curCase.path << "\""
									<< ", expecting " << getMatchCaseExpectedDesc(curCase.expected)
				<< TestLog::EndMessage;

			matchGroup	= caseListFilter->checkTestGroupName(curCase.path);
			matchCase	= caseListFilter->checkTestCaseName(curCase.path);

			if ((matchGroup	== (curCase.expected == MatchCase::MATCH_GROUP)) &&
				(matchCase	== (curCase.expected == MatchCase::MATCH_CASE)))
			{
				log << TestLog::Message << "   pass" << TestLog::EndMessage;
				numPass += 1;
			}
			else
				log << TestLog::Message << "   FAIL!" << TestLog::EndMessage;
		}

		m_testCtx.setTestResult((numPass == m_numSubCases) ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								(numPass == m_numSubCases) ? "All passed"			: "Unexpected match result");

		return STOP;
	}